

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_SubDEdgePtrLink>::Append
          (ON_SimpleArray<ON_SubDEdgePtrLink> *this,ON_SubDEdgePtrLink *x)

{
  uint uVar1;
  int iVar2;
  ON_SubDEdgePtrLink *pOVar3;
  void *temp;
  ON_SubDEdgePtrLink *pOStack_20;
  int newcapacity;
  ON_SubDEdgePtrLink *p;
  ON_SubDEdgePtrLink *x_local;
  ON_SimpleArray<ON_SubDEdgePtrLink> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_SubDEdgePtrLink *)onmalloc(0x10);
      (pOStack_20->m_ep).m_ptr = (x->m_ep).m_ptr;
      uVar1 = x->m_nbr_index;
      pOStack_20->m_index = x->m_index;
      pOStack_20->m_nbr_index = uVar1;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (ON_SubDEdgePtrLink *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  pOVar3 = this->m_a + iVar2;
  (pOVar3->m_ep).m_ptr = (pOStack_20->m_ep).m_ptr;
  uVar1 = pOStack_20->m_nbr_index;
  pOVar3->m_index = pOStack_20->m_index;
  pOVar3->m_nbr_index = uVar1;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}